

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkRef.hpp
# Opt level: O2

Checked<vk::VkDevice_s_*> vk::refdetails::check<vk::VkDevice_s*>(VkDevice_s *object)

{
  TestError *this;
  char *__s;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (object != (VkDevice_s *)0x0) {
    return (Checked<vk::VkDevice_s_*>)object;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  __s = getTypeName<vk::VkDevice_s*>();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_59);
  std::operator+(&local_38,&local_58," = 0");
  tcu::TestError::TestError
            (this,"Object check() failed",local_38._M_dataplus._M_p,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkRef.hpp"
             ,0x35);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

inline Checked<T> check (T object)
{
	if (!object)
		throw tcu::TestError("Object check() failed", (std::string(getTypeName<T>()) + " = 0").c_str(), __FILE__, __LINE__);
	return Checked<T>(object);
}